

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  int dynamicsz;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  FILE *__stream;
  object *poVar5;
  object *poVar6;
  object *poVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  undefined1 auVar11 [16];
  object *aProcess;
  char imageFileName [120];
  object *local_b0;
  char local_a8 [120];
  long lVar12;
  
  puts("Little Smalltalk starting up...");
  builtin_strncpy(local_a8,"lst.img",8);
  tmpdir = "/tmp";
  prog_argc = argc;
  prog_argv = argv;
  pcVar4 = getenv("TMPDIR");
  if (pcVar4 != (char *)0x0) {
    tmpdir = strdup(pcVar4);
  }
  iVar3 = 300000;
  dynamicsz = 300000;
  if (1 < argc) {
    iVar10 = 1;
    do {
      pcVar4 = argv[iVar10];
      if (*pcVar4 == '-') {
        if ((pcVar4[1] == 'v') && (pcVar4[2] == '\0')) {
          puts("Little Smalltalk, version 4.7.2");
        }
        else if ((pcVar4[1] == 's') && (pcVar4[2] == '\0')) {
          iVar3 = atoi(argv[(long)iVar10 + 1]);
          iVar10 = iVar10 + 1;
        }
        else if ((pcVar4[1] == 'd') && (pcVar4[2] == '\0')) {
          dynamicsz = atoi(argv[(long)iVar10 + 1]);
          iVar10 = iVar10 + 1;
        }
        else {
          if ((pcVar4[1] != 'g') || (pcVar4[2] != '\0')) goto LAB_00102f19;
          info_impl("main",0x55,"Turning on debugging.");
          debugging = 1;
        }
      }
      else {
LAB_00102f19:
        strcpy(local_a8,pcVar4);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < argc);
  }
  info_impl("main",0x60,"Initializing GC memory pool.");
  gcinit(iVar3,dynamicsz);
  info_impl("main",100,"Reading in image from file %s.",local_a8);
  __stream = fopen(local_a8,"rb");
  if (__stream == (FILE *)0x0) {
    error_impl("main",0x69,"cannot open image file: %s!",local_a8);
  }
  uVar2 = fileIn((FILE *)__stream);
  info_impl("main",0x6c,"%d objs/cells in image.",(ulong)uVar2);
  fclose(__stream);
  info_impl("find_initial_method",0xe4,"Finding initial method.");
  info_impl("find_initial_method",0xe6,"Checking for web IDE.");
  poVar5 = lookupGlobal("WebIDE");
  if (poVar5 == (object *)0x0) {
    info_impl("find_initial_method",0xf4,"Checking for commandline REPL.");
    poVar5 = lookupGlobal("REPL");
    if (poVar5 != (object *)0x0) {
      initialMethod = dictLookup((object *)poVar5[2].header,"start");
      if (initialMethod == (object *)0x0) {
        error_impl("find_initial_method",0xfa,"Unable to find method #start in REPL class!");
      }
      pcVar4 = "Found #start method in REPL class.";
      iVar3 = 0xfd;
      goto LAB_0010313d;
    }
    error_impl("find_initial_method",0x102,"Unable to find start up class!");
  }
  else {
    initialMethod = dictLookup((object *)poVar5[2].header,"start");
    if (initialMethod == (object *)0x0) {
      error_impl("find_initial_method",0xec,"Unable to find method #start in WebIDE class!");
    }
    pcVar4 = "Found #start method in WebIDE class.";
    iVar3 = 0xef;
LAB_0010313d:
    info_impl("find_initial_method",iVar3,pcVar4);
  }
  addStaticRoot(&initialMethod);
  if (debugging != 0) {
    dumpMethod(initialMethod,0);
  }
  info_impl("main",0x7a,"Setting up root process.");
  poVar5 = (object *)&memoryPointer[-3].class;
  memoryPointer = poVar5;
  if ((long)poVar5 < (long)memoryBase) {
    poVar5 = gcollect(3);
  }
  else {
    *(object **)poVar5 = (object *)0xc;
  }
  local_b0 = poVar5;
  poVar6 = lookupGlobal("Process");
  poVar5->class = poVar6;
  poVar6 = nilObject;
  poVar5[1].header = (uintptr_t)nilObject;
  poVar5[1].class = poVar6;
  poVar5[2].header = (uintptr_t)poVar6;
  addStaticRoot(&local_b0);
  info_impl("main",0x83,"Setting up root context.");
  poVar5 = (object *)&memoryPointer[-5].class;
  memoryPointer = poVar5;
  if ((long)poVar5 < (long)memoryBase) {
    poVar5 = gcollect(7);
  }
  else {
    *(object **)poVar5 = (object *)0x1c;
  }
  poVar5->class = ContextClass;
  poVar6 = nilObject;
  auVar1 = _DAT_00109020;
  lVar8 = 3;
  auVar11 = _DAT_00109010;
  do {
    if (SUB164(auVar11 ^ auVar1,4) == -0x80000000 && SUB164(auVar11 ^ auVar1,0) < -0x7ffffff9) {
      *(object **)((long)poVar5 + lVar8 * 8 + -8) = poVar6;
      (&poVar5->header)[lVar8] = (uintptr_t)poVar6;
    }
    lVar12 = auVar11._8_8_;
    auVar11._0_8_ = auVar11._0_8_ + 2;
    auVar11._8_8_ = lVar12 + 2;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 0xb);
  local_b0[1].header = (uintptr_t)poVar5;
  uVar2 = (uint)((ulong)initialMethod[2].class >> 1);
  poVar6 = (object *)((long)&memoryPointer->header + (long)(int)(uVar2 * -8 + -0x10));
  memoryPointer = poVar6;
  if ((long)poVar6 < (long)memoryBase) {
    poVar6 = gcollect(uVar2);
  }
  else {
    poVar6->header = (ulong)(uVar2 * 4);
  }
  poVar5[2].class = poVar6;
  poVar6->class = ArrayClass;
  poVar6 = nilObject;
  if (0 < (int)uVar2) {
    uVar9 = 0;
    do {
      (&poVar5[2].class[1].header)[uVar9] = (uintptr_t)poVar6;
      uVar9 = uVar9 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar9);
  }
  poVar6 = nilObject;
  poVar5[1].class = nilObject;
  poVar7 = (object *)&memoryPointer[-0xb].class;
  memoryPointer = poVar7;
  if ((long)poVar7 < (long)memoryBase) {
    poVar7 = gcollect(0x13);
    poVar6 = nilObject;
  }
  else {
    *(object **)poVar7 = (object *)0x4c;
  }
  poVar5[2].header = (uintptr_t)poVar7;
  poVar7->class = ArrayClass;
  lVar8 = 2;
  do {
    *(object **)(poVar5[2].header + lVar8 * 8) = poVar6;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x15);
  poVar5[3].header = 1;
  poVar5[3].class = (object *)0x1;
  poVar5[4].header = (uintptr_t)nilObject;
  poVar5[1].header = (uintptr_t)initialMethod;
  lVar8 = (long)rootTop;
  rootTop = rootTop + 1;
  rootStack[lVar8] = local_b0;
  info_impl("main",0xae,"Starting execution.");
  iVar3 = execute(local_b0,0);
  switch(iVar3) {
  case 2:
    pcVar4 = "User defined return";
    break;
  case 3:
    puts("can\'t find method in call");
    lVar8 = (long)rootTop;
    rootTop = rootTop + -1;
    local_b0 = (&oldTop)[lVar8];
    printf("Unknown method: %s\n",local_b0[2].header + 0x10);
    backTrace((object *)local_b0[1].header);
    goto LAB_00103479;
  case 4:
    pcVar4 = "normal return";
    break;
  case 5:
    pcVar4 = "time out";
    break;
  default:
    pcVar4 = "unknown return code";
  }
  puts(pcVar4);
LAB_00103479:
  if (cache_miss + cache_hit != 0 && SCARRY8(cache_miss,cache_hit) == cache_miss + cache_hit < 0) {
    puts("\nCache statistics:");
    printf("  %ld hit, %ld miss for %02.2f%% hit rate.\n",
           (double)(float)(((double)cache_hit * 100.0) / (double)(cache_miss + cache_hit)));
  }
  puts("\nGC statistics:");
  printf("  %ld garbage collections\n",gc_count);
  if (0 < gc_count) {
    printf("  %ld total microseconds in GC for %ld microseconds per GC pass.\n",gc_total_time,
           gc_total_time / gc_count);
    printf("  %ld microseconds for longest GC pause.\n",gc_max_time);
    printf("  %ld total bytes copied for %ld bytes per GC on average.\n",gc_total_mem_copied,
           gc_total_mem_copied / gc_count);
    printf("  %ld maximum bytes copied during GC.\n",gc_mem_max_copied);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    struct object *aProcess, *aContext, *o;
    int size, i, staticSize, dynamicSize;
    FILE *fp;
    char imageFileName[120], *p;

    printf("Little Smalltalk starting up...\n");

    prog_argc = argc;
    prog_argv = (const char **)argv;

    strcpy(imageFileName, DefaultImageFile);
    staticSize = DefaultStaticSize;
    dynamicSize = DefaultDynamicSize;
    tmpdir = DefaultTmpdir;

    /*
     * See if our environment tells us what TMPDIR to use
     */
    p = getenv("TMPDIR");
    if (p) {
        tmpdir = strdup(p);
    }

    /* first parse arguments */
    for (i = 1; i < argc; i++) {
        if (strcmp(argv[i], "-v") == 0) {
            /* FIXME - this should be generated by CMake. */
            printf("Little Smalltalk, version " VERSION_STRING "\n");
        } else if (strcmp(argv[i], "-s") == 0) {
            staticSize = atoi(argv[++i]);
        } else if (strcmp(argv[i], "-d") == 0) {
            dynamicSize = atoi(argv[++i]);
        } else if (strcmp(argv[i], "-g") == 0) {
            info("Turning on debugging.");
            debugging = 1;
        } else {
            strcpy(imageFileName, argv[i]);
        }
    }

# ifdef COUNTTEMPS
    tempFile = fopen("/usr/tmp/counts", "w");
# endif

    info("Initializing GC memory pool.");

    gcinit(staticSize, dynamicSize);

    info("Reading in image from file %s.", imageFileName);

    /* read in the method from the image file */
    fp = fopen(imageFileName, "rb");
    if (! fp) {
        error("cannot open image file: %s!", imageFileName);
    }

    info("%d objs/cells in image.", fileIn(fp));
    fclose(fp);

    /* find the initial method. */
    find_initial_method();
    addStaticRoot(&initialMethod);

    if(debugging) {
        /* dump startup method */
        dumpMethod(initialMethod, 0);
    }

    /* build the root process with a context, make sure it is GC-proof */

    info("Setting up root process.");

    aProcess = gcalloc(processSize);
    aProcess->class = lookupGlobal("Process");
    for(int i=0; i< processSize; i++) {
        aProcess->data[i] = nilObject;
    }
    addStaticRoot(&aProcess);

    info("Setting up root context.");

    /* context should be dynamic */
    aContext = gcalloc(contextSize);
    aContext->class = ContextClass;
    for(int i=0; i< contextSize; i++) {
        aContext->data[i] = nilObject;
    }

    /* add the context to the process. */
    aProcess->data[contextInProcess] = aContext;

    /* set up context stack */
    size = integerValue(initialMethod->data[stackSizeInMethod]);
    aContext->data[stackInContext] = gcalloc(size);
    aContext->data[stackInContext]->class = ArrayClass;
    for(int i=0; i < size; i++) {
        aContext->data[stackInContext]->data[i] = nilObject;
    }

    /* set up arguments, none. */
    aContext->data[argumentsInContext] = nilObject;

    /* set up temporary array. */
    size = 19;  /* where is this number from? */
    aContext->data[temporariesInContext] = gcalloc(size);
    aContext->data[temporariesInContext]->class = ArrayClass;
    for(int i=0; i < size; i++) {
        aContext->data[temporariesInContext]->data[i] = nilObject;
    }

    aContext->data[bytePointerInContext] = newInteger(0);
    aContext->data[stackTopInContext] = newInteger(0);
    aContext->data[previousContextInContext] = nilObject;
    aContext->data[methodInContext] = initialMethod;

    /* now go do it */
    rootStack[rootTop++] = aProcess;

#if defined(PROFILE)
    take_samples(1);
#endif

    info("Starting execution.");

    switch(execute(aProcess, 0)) {
    case 2:
        printf("User defined return\n");
        break;

    case 3:
        printf("can't find method in call\n");
        aProcess = rootStack[--rootTop];
        o = aProcess->data[resultInProcess];
        printf("Unknown method: %s\n", bytePtr(o));
        aContext = aProcess->data[contextInProcess];
        backTrace(aContext);
        break;

    case 4:
        printf("normal return\n");
        break;

    case 5:
        printf("time out\n");
        break;

    default:
        printf("unknown return code\n");
        break;
    }
#if defined(VSTA) && defined(PROFILE)
    dump_samples();
#endif

    if((cache_hit + cache_miss) > 0) {
        printf("\nCache statistics:\n");
        printf("  %" PRId64 " hit, %" PRId64 " miss for %02.2f%% hit rate.\n", cache_hit, cache_miss, (float)((float)(cache_hit)*100.0/(float)(cache_hit + cache_miss)));
    }

    printf("\nGC statistics:\n");
    printf("  %" PRId64 " garbage collections\n", gc_count);
    if(gc_count > 0) {
        printf("  %" PRId64 " total microseconds in GC for %" PRId64 " microseconds per GC pass.\n", gc_total_time, gc_total_time/gc_count);
        printf("  %" PRId64 " microseconds for longest GC pause.\n", gc_max_time);
        printf("  %" PRId64 " total bytes copied for %" PRId64 " bytes per GC on average.\n", gc_total_mem_copied, gc_total_mem_copied/gc_count);
        printf("  %" PRId64 " maximum bytes copied during GC.\n", gc_mem_max_copied);
    }

    return(0);
}